

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

size_t tinyexr::SaveEXRNPartImageToMemory
                 (EXRImage *exr_images,EXRHeader **exr_headers,uint num_parts,uchar **memory_out,
                 char **err)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  EXRAttribute *pEVar5;
  pointer pvVar6;
  long *plVar7;
  EXRTile *pEVar8;
  pointer pvVar9;
  undefined8 uVar10;
  undefined4 *puVar11;
  uchar **images;
  int *piVar12;
  void *pvVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  char **ppcVar19;
  pointer puVar20;
  undefined1 auVar21 [12];
  bool bVar22;
  bool bVar23;
  int iVar24;
  uint uVar25;
  uint uVar26;
  int iVar27;
  int iVar28;
  char *pcVar29;
  size_type *psVar30;
  pointer pTVar31;
  EXRImage *pEVar32;
  size_t sVar33;
  EXRHeader *pEVar34;
  pointer pvVar35;
  pointer pOVar36;
  uchar *puVar37;
  pointer pvVar38;
  undefined8 uVar39;
  byte bVar40;
  int iVar41;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *pvVar42;
  size_type sVar43;
  byte bVar44;
  unsigned_long uVar45;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *pvVar46;
  undefined1 *puVar47;
  pointer __dest;
  int iVar48;
  long lVar49;
  pointer puVar50;
  long lVar51;
  size_type sVar52;
  long lVar53;
  long lVar54;
  long lVar55;
  int iVar56;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *__n;
  pointer __size;
  ulong uVar57;
  EXRHeader **ppEVar58;
  long lVar59;
  long lVar60;
  bool bVar61;
  bool bVar62;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar63;
  string *in_stack_fffffffffffffdc8;
  EXRHeader **ppEVar64;
  int local_228;
  pointer local_218;
  EXRImage *local_210;
  char header [4];
  undefined4 uStack_204;
  pointer pTStack_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  int local_1e8;
  int local_1e4;
  undefined8 local_1e0;
  uchar local_1d8;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *local_1d0;
  uint local_1c4;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *local_1c0;
  char **local_1b8;
  allocator local_1a9;
  EXRImage *local_1a8;
  undefined8 local_1a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> memory;
  vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
  data_lists;
  long local_140;
  vector<int,_std::allocator<int>_> num_y_tiles;
  vector<int,_std::allocator<int>_> chunk_count;
  ulong local_f0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> channel_offset_list;
  vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_> offset_data;
  vector<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>,_std::allocator<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>_>_>
  channels;
  
  auVar21 = _uStack_204;
  if (memory_out == (uchar **)0x0 ||
      (exr_headers == (EXRHeader **)0x0 || exr_images == (EXRImage *)0x0)) {
    _header = (pointer)&local_1f8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)header,"Invalid argument for SaveEXRNPartImageToMemory","");
    if (err != (char **)0x0) {
      pcVar29 = strdup(_header);
      *err = pcVar29;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_header != &local_1f8) {
      operator_delete(_header);
    }
LAB_001ccd4a:
    __size = (pointer)0x0;
  }
  else {
    __n = (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           *)(ulong)num_parts;
    bVar61 = num_parts != 0;
    local_1b8 = err;
    if (bVar61) {
      pvVar42 = (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 *)0x1;
      do {
        if (exr_headers
            [(long)((long)&pvVar42[-1].
                           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7)]->
            compression_type < 0) {
          _header = (pointer)&local_1f8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)header,"Invalid argument for SaveEXRNPartImageToMemory","");
          ppcVar19 = local_1b8;
          if (local_1b8 != (char **)0x0) {
            pcVar29 = strdup(_header);
            *ppcVar19 = pcVar29;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_header != &local_1f8) {
LAB_001ccd3b:
            operator_delete(_header);
          }
LAB_001ccd40:
          auVar21 = _uStack_204;
          if (bVar61) goto LAB_001ccd4a;
          break;
        }
        if (exr_headers
            [(long)((long)&pvVar42[-1].
                           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7)]->
            compression_type == 0x80) {
          _header = (pointer)&local_1f8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)header,"ZFP compression is not supported in this build","");
          ppcVar19 = local_1b8;
          if (local_1b8 != (char **)0x0) {
            pcVar29 = strdup(_header);
            *ppcVar19 = pcVar29;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_header != &local_1f8) goto LAB_001ccd3b;
          goto LAB_001ccd40;
        }
        bVar61 = pvVar42 < __n;
        bVar62 = pvVar42 != __n;
        pvVar42 = (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   *)((long)&(pvVar42->
                             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + 1);
      } while (bVar62);
    }
    _uStack_204 = auVar21;
    memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    builtin_strncpy(header,"v/1\x01",4);
    ppEVar58 = exr_headers;
    std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<char_const*>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&memory,0,header);
    header[0] = '\x02';
    header[1] = '\0';
    header[2] = '\0';
    header[3] = '\0';
    if ((num_parts == 1) && (exr_images->tiles != (EXRTile *)0x0)) {
      header[0] = '\x02';
      header[1] = '\x02';
    }
    if ((*exr_headers)->long_name != 0) {
      header._0_2_ = header._0_2_ | 0x400;
    }
    if (1 < num_parts) {
      header._0_2_ = header._0_2_ | 0x1000;
    }
    std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<char*>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&memory,
               memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish,header);
    std::vector<int,_std::allocator<int>_>::vector
              (&chunk_count,(size_type)__n,(allocator_type *)header);
    std::vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>::vector
              (&offset_data,(size_type)__n,(allocator_type *)header);
    local_218 = (pointer)0x0;
    local_1c4 = num_parts;
    local_1a8 = exr_images;
    if (num_parts != 0) {
      pvVar42 = (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 *)0x0;
      iVar48 = 0;
      exr_headers = ppEVar58;
      do {
        if (local_1a8[(long)pvVar42].tiles == (EXRTile *)0x0) {
          iVar24 = exr_headers[(long)pvVar42]->compression_type;
          iVar41 = 0x10;
          if ((iVar24 != 3) && (iVar24 != 0x80)) {
            if (iVar24 == 4) {
              iVar41 = 0x20;
            }
            else {
              iVar41 = 1;
            }
          }
          chunk_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[(long)pvVar42] = (local_1a8[(long)pvVar42].height + iVar41 + -1) / iVar41;
          InitSingleResolutionOffsets
                    (offset_data.
                     super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>.
                     _M_impl.super__Vector_impl_data._M_start + (long)pvVar42,
                     (long)chunk_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[(long)pvVar42]);
          iVar24 = chunk_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[(long)pvVar42];
        }
        else {
          _header = (undefined1  [16])0x0;
          local_1f8._M_allocated_capacity = 0;
          num_y_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          num_y_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          num_y_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          ppEVar58 = exr_headers;
          PrecalculateTileInfo
                    ((vector<int,_std::allocator<int>_> *)header,&num_y_tiles,
                     exr_headers[(long)pvVar42]);
          iVar24 = InitTileOffsets(offset_data.
                                   super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>
                                   ._M_impl.super__Vector_impl_data._M_start + (long)pvVar42,
                                   exr_headers[(long)pvVar42],
                                   (vector<int,_std::allocator<int>_> *)header,&num_y_tiles);
          chunk_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[(long)pvVar42] = iVar24;
          iVar24 = chunk_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[(long)pvVar42];
          exr_headers = ppEVar58;
          if (num_y_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(num_y_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
            exr_headers = ppEVar58;
          }
          if ((pointer)_header != (pointer)0x0) {
            operator_delete(_header);
          }
        }
        iVar48 = iVar48 + iVar24;
        pvVar42 = (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   *)((long)&(pvVar42->
                             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + 1);
      } while (pvVar42 != __n);
      local_218 = (pointer)((long)iVar48 << 3);
      ppEVar58 = exr_headers;
    }
    uVar25 = local_1c4;
    std::
    vector<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>,_std::allocator<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>_>_>
    ::vector(&channels,(size_type)__n,(allocator_type *)header);
    num_y_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish._0_4_ = 0;
    num_y_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if (uVar25 != 0) {
      pvVar42 = (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 *)0x0;
      do {
        data_lists.
        super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        data_lists.
        super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        data_lists.
        super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pEVar34 = exr_headers[(long)pvVar42];
        if (0 < pEVar34->num_channels) {
          local_1d0 = (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       *)((long)pvVar42 * 0x18);
          lVar59 = 0;
          lVar49 = 0;
          do {
            pTStack_200 = (pointer)0x0;
            _header = (pointer)&local_1f8;
            local_1f8._M_allocated_capacity = local_1f8._M_allocated_capacity & 0xffffffffffffff00;
            local_1d8 = '\0';
            local_1e8 = pEVar34->pixel_types[lVar49];
            local_1e4 = pEVar34->requested_pixel_types[lVar49];
            local_1e0._0_4_ = 1;
            local_1e0._4_4_ = 1;
            std::__cxx11::string::string
                      ((string *)&channel_offset_list,pEVar34->channels->name + lVar59,&local_1a9);
            std::__cxx11::string::operator=((string *)header,(string *)&channel_offset_list);
            if ((pointer *)
                channel_offset_list.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start !=
                &channel_offset_list.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage) {
              operator_delete(channel_offset_list.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>::push_back
                      ((vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *)
                       ((long)&((channels.
                                 super__Vector_base<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>,_std::allocator<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                               )._M_impl.super__Vector_impl_data._M_start +
                       (long)&(local_1d0->
                              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start),(value_type *)header);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_header != &local_1f8) {
              operator_delete(_header);
            }
            lVar49 = lVar49 + 1;
            pEVar34 = exr_headers[(long)pvVar42];
            lVar59 = lVar59 + 0x110;
          } while (lVar49 < pEVar34->num_channels);
        }
        exr_headers = ppEVar58;
        pvVar35 = channels.
                  super__Vector_base<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>,_std::allocator<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pTVar31 = channels.
                  super__Vector_base<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>,_std::allocator<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[(long)pvVar42].
                  super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        lVar49 = (long)channels.
                       super__Vector_base<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>,_std::allocator<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(long)pvVar42].
                       super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar31;
        if (lVar49 == 0) {
          sVar52 = 1;
        }
        else {
          lVar49 = (lVar49 >> 3) * 0x6db6db6db6db6db7;
          lVar49 = lVar49 + (ulong)(lVar49 == 0);
          psVar30 = &(pTVar31->name)._M_string_length;
          lVar59 = 0;
          do {
            lVar51 = lVar59 + *psVar30;
            lVar59 = lVar51 + 0x11;
            psVar30 = psVar30 + 7;
            lVar49 = lVar49 + -1;
          } while (lVar49 != 0);
          sVar52 = lVar51 + 0x12;
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&data_lists,sVar52);
        if (data_lists.
            super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            data_lists.
            super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          lVar49 = 0;
LAB_001ce2ec:
          uVar39 = std::__throw_out_of_range_fmt
                             ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                              ,0,lVar49);
          std::
          vector<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>,_std::allocator<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>_>_>
          ::~vector(&channels);
          std::vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>::~vector
                    (&offset_data);
          if (chunk_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(chunk_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          _Unwind_Resume(uVar39);
        }
        pvVar35 = pvVar35 + (long)pvVar42;
        pTVar31 = (pvVar35->
                  super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>)
                  ._M_impl.super__Vector_impl_data._M_start;
        __dest = data_lists.
                 super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_1d0 = pvVar42;
        if ((pvVar35->
            super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>).
            _M_impl.super__Vector_impl_data._M_finish != pTVar31) {
          lVar49 = 0;
          uVar57 = 0;
          do {
            memcpy(__dest,*(void **)(pTVar31->pad + lVar49 + -0x31),
                   *(size_t *)(pTVar31->pad + lVar49 + -0x29));
            puVar47 = (undefined1 *)
                      ((long)&(__dest->
                              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start +
                      *(long *)(((pvVar35->
                                 super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->pad + lVar49 + -0x29))
            ;
            __dest = (pointer)(puVar47 + 0x11);
            *puVar47 = 0;
            pTVar31 = (pvVar35->
                      super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            uVar39 = *(undefined8 *)(pTVar31->pad + lVar49 + -9);
            *(undefined4 *)(puVar47 + 1) = *(undefined4 *)(pTVar31->pad + lVar49 + -0xd);
            puVar47[5] = ((pvVar35->
                          super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                          )._M_impl.super__Vector_impl_data._M_start)->pad[lVar49 + -1];
            *(undefined8 *)(puVar47 + 9) = uVar39;
            uVar57 = uVar57 + 1;
            pTVar31 = (pvVar35->
                      super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            lVar49 = lVar49 + 0x38;
          } while (uVar57 < (ulong)(((long)(pvVar35->
                                           super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pTVar31 >> 3) * 0x6db6db6db6db6db7));
        }
        *(undefined1 *)
         &(__dest->
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start = 0;
        lVar49 = (long)data_lists.
                       super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)data_lists.
                       super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        if (lVar49 == 0) goto LAB_001ce2ec;
        WriteAttributeToMemory
                  (&memory,"channels","chlist",
                   (uchar *)data_lists.
                            super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,(int)lVar49);
        uVar25 = local_1c4;
        pvVar46 = local_1d0;
        if (data_lists.
            super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(data_lists.
                          super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        header = (char  [4])exr_headers[(long)pvVar46]->compression_type;
        WriteAttributeToMemory(&memory,"compression","compression",(uchar *)header,1);
        pEVar32 = local_1a8;
        uVar1 = local_1a8[(long)pvVar42].width;
        uVar3 = local_1a8[(long)pvVar42].height;
        auVar18._4_4_ = uVar3 + -1;
        auVar18._0_4_ = uVar1 + -1;
        auVar18._8_8_ = 0;
        _header = auVar18 << 0x40;
        WriteAttributeToMemory(&memory,"dataWindow","box2i",(uchar *)header,0x10);
        channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        uVar2 = pEVar32->width;
        uVar4 = pEVar32->height;
        channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)CONCAT44(uVar4 + -1,uVar2 + -1);
        WriteAttributeToMemory(&memory,"displayWindow","box2i",(uchar *)&channel_offset_list,0x10);
        auVar14[0xf] = 0;
        auVar14._0_15_ = stack0xfffffffffffffdf9;
        _header = auVar14 << 8;
        WriteAttributeToMemory(&memory,"lineOrder","lineOrder",(uchar *)header,1);
        header[0] = '\0';
        header[1] = '\0';
        header[2] = -0x80;
        header[3] = '?';
        WriteAttributeToMemory(&memory,"pixelAspectRatio","float",(uchar *)header,4);
        auVar15._8_8_ = 0;
        auVar15._0_8_ = pTStack_200;
        _header = auVar15 << 0x40;
        WriteAttributeToMemory(&memory,"screenWindowCenter","v2f",(uchar *)header,8);
        header[0] = '\0';
        header[1] = '\0';
        header[2] = -0x80;
        header[3] = '?';
        WriteAttributeToMemory(&memory,"screenWindowWidth","float",(uchar *)header,4);
        pEVar32 = local_1a8 + (long)pvVar42;
        if (pEVar32->tiles != (EXRTile *)0x0) {
          pEVar34 = exr_headers[(long)pvVar46];
          bVar40 = (byte)pEVar34->tile_level_mode & 3;
          bVar44 = bVar40 + 0x10;
          if (pEVar34->tile_rounding_mode == 0) {
            bVar44 = bVar40;
          }
          pTStack_200._0_4_ = 0;
          pTStack_200._0_1_ = bVar44;
          header = (char  [4])pEVar34->tile_size_x;
          uStack_204 = pEVar34->tile_size_y;
          WriteAttributeToMemory(&memory,"tiles","tiledesc",(uchar *)header,9);
        }
        if (1 < uVar25) {
          pEVar34 = exr_headers[(long)pvVar46];
          sVar33 = strlen(pEVar34->name);
          if (sVar33 == 0) {
            _header = (pointer)&local_1f8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)header,"Invalid \'name\' attribute for a multi-part file","");
            ppcVar19 = local_1b8;
            if (local_1b8 != (char **)0x0) {
              pcVar29 = strdup(_header);
              *ppcVar19 = pcVar29;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_header != &local_1f8) {
LAB_001cd682:
              operator_delete(_header);
            }
          }
          else {
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_emplace_unique<char_const(&)[256]>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&num_y_tiles,&pEVar34->name);
            if (pvVar46 ==
                (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 *)0xffffffffffffffff) {
              WriteAttributeToMemory
                        (&memory,"name","string",(uchar *)exr_headers[-1]->name,(int)sVar33);
              bVar61 = pEVar32->tiles == (EXRTile *)0x0;
              pcVar29 = "tiledimage";
              if (bVar61) {
                pcVar29 = "scanlineimage";
              }
              WriteAttributeToMemory(&memory,"type","string",(uchar *)pcVar29,(uint)bVar61 * 3 + 10)
              ;
              WriteAttributeToMemory
                        (&memory,"chunkCount","int",
                         (uchar *)(chunk_count.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                   .super__Vector_impl_data._M_start + -1),4);
              goto LAB_001cd4ec;
            }
            _header = (pointer)&local_1f8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)header,"\'name\' attributes must be unique for a multi-part file",
                       "");
            ppcVar19 = local_1b8;
            if (local_1b8 != (char **)0x0) {
              pcVar29 = strdup(_header);
              *ppcVar19 = pcVar29;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_header != &local_1f8) goto LAB_001cd682;
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&num_y_tiles);
          __size = (pointer)0x0;
          goto LAB_001ce296;
        }
LAB_001cd4ec:
        if ((0 < exr_headers[(long)pvVar46]->num_custom_attributes) &&
           (pEVar34 = exr_headers[(long)pvVar46], 0 < pEVar34->num_custom_attributes)) {
          lVar49 = 0;
          lVar59 = 0;
          do {
            pEVar5 = pEVar34->custom_attributes;
            WriteAttributeToMemory
                      (&memory,pEVar5->name + lVar49,pEVar5->type + lVar49,
                       *(uchar **)((long)&pEVar5->value + lVar49),
                       *(int *)((long)&pEVar5->size + lVar49));
            lVar59 = lVar59 + 1;
            pEVar34 = exr_headers[(long)pvVar46];
            lVar49 = lVar49 + 0x210;
          } while (lVar59 < pEVar34->num_custom_attributes);
        }
        auVar16[0xf] = 0;
        auVar16._0_15_ = stack0xfffffffffffffdf9;
        _header = auVar16 << 8;
        if (memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
          _M_realloc_insert<unsigned_char>
                    (&memory,(iterator)
                             memory.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish,(uchar *)header);
        }
        else {
          *memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish = '\0';
          memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish =
               memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        pvVar42 = (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   *)((long)&(pvVar46->
                             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + 1);
        ppEVar58 = exr_headers;
      } while (pvVar42 != __n);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&num_y_tiles);
    if (1 < uVar25) {
      auVar17[0xf] = 0;
      auVar17._0_15_ = stack0xfffffffffffffdf9;
      _header = auVar17 << 8;
      if (memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                  (&memory,(iterator)
                           memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_finish,(uchar *)header);
      }
      else {
        *memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish = '\0';
        memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish =
             memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
    }
    puVar20 = memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish;
    puVar50 = memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    std::
    vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
    ::vector(&data_lists,(size_type)__n,(allocator_type *)header);
    ppEVar64 = ppEVar58;
    if (uVar25 == 0) {
      __size = (pointer)0x0;
      uVar25 = 0;
    }
    else {
      lVar49 = (ulong)(1 < uVar25) * 4;
      pvVar42 = (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 *)0x0;
      __size = (pointer)0x0;
      local_218 = puVar20 + ((long)local_218 - (long)puVar50);
      do {
        num_y_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        num_y_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)&num_y_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
        num_y_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage =
             (pointer)((ulong)num_y_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
        pEVar34 = ppEVar58[(long)pvVar42];
        iVar48 = pEVar34->compression_type;
        local_1a0 = 0x10;
        if ((iVar48 != 3) && (iVar48 != 0x80)) {
          if (iVar48 == 4) {
            local_1a0 = 0x20;
          }
          else {
            local_1a0 = 1;
          }
        }
        pvVar35 = channels.
                  super__Vector_base<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>,_std::allocator<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + (long)pvVar42;
        iVar48 = chunk_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[(long)pvVar42];
        sVar52 = (size_type)iVar48;
        pOVar36 = offset_data.
                  super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>.
                  _M_impl.super__Vector_impl_data._M_start + (long)pvVar42;
        local_1c0 = data_lists.
                    super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + (long)pvVar42;
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::resize(local_1c0,sVar52);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  (&channel_offset_list,(long)pEVar34->num_channels,(allocator_type *)header);
        if (pEVar34->num_channels == 0) {
          iVar24 = 0;
        }
        else {
          iVar24 = 0;
          lVar59 = 0x24;
          uVar45 = 0;
          uVar57 = 0;
          do {
            channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar57] = uVar45;
            iVar41 = *(int *)(((pvVar35->
                               super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                               )._M_impl.super__Vector_impl_data._M_start)->pad + lVar59 + -0x31);
            if ((iVar41 == 0) || (iVar41 == 2)) {
              iVar24 = iVar24 + 4;
              uVar45 = uVar45 + 4;
            }
            else if (iVar41 == 1) {
              iVar24 = iVar24 + 2;
              uVar45 = uVar45 + 2;
            }
            uVar57 = uVar57 + 1;
            lVar59 = lVar59 + 0x38;
          } while (uVar57 < (ulong)(long)pEVar34->num_channels);
        }
        local_210 = local_1a8 + (long)pvVar42;
        iVar41 = (int)pvVar35;
        if (local_210->tiles == (EXRTile *)0x0) {
          plVar7 = *(long **)&(((pOVar36->offsets).
                                super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                              )._M_impl;
          if (iVar48 < 1) {
            bVar61 = false;
          }
          else {
            local_1d0 = (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)CONCAT44(local_1d0._4_4_,(int)local_1a0);
            iVar27 = 0;
            lVar59 = 0;
            iVar56 = 0;
            ppEVar58 = ppEVar64;
            bVar62 = false;
            do {
              pvVar46 = local_1c0;
              iVar28 = local_210->height;
              images = local_210->images;
              pvVar63 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1cdd91;
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         ((long)&(((local_1c0->
                                   super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                 _M_impl.super__Vector_impl_data + lVar59),8);
              if ((int)local_1d0 <= iVar28) {
                iVar28 = (int)local_1d0;
              }
              pvVar9 = (pvVar46->
                       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              uVar39 = *(undefined8 *)
                        ((long)&(pvVar9->
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                _M_impl.super__Vector_impl_data + lVar59);
              uVar10 = *(undefined8 *)
                        ((long)&(pvVar9->
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                _M_impl.super__Vector_impl_data + lVar59 + 8);
              bVar23 = EncodePixelData((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       ((long)&(pvVar9->
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               )._M_impl.super__Vector_impl_data + lVar59),images,
                                       pEVar34->compression_type,local_210->width,local_210->width,
                                       iVar27,iVar28 + iVar56,iVar24,iVar41,
                                       (size_t)&channel_offset_list,
                                       (vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                                        *)&num_y_tiles,pvVar63,in_stack_fffffffffffffdc8,ppEVar58);
              bVar61 = true;
              if (bVar23) {
                pvVar9 = (local_1c0->
                         super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                iVar28 = *(int *)((long)&(pvVar9->
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         )._M_impl.super__Vector_impl_data + lVar59 + 8);
                piVar12 = *(int **)((long)&(pvVar9->
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           )._M_impl.super__Vector_impl_data + lVar59);
                *piVar12 = iVar27;
                *(int *)(*(long *)((long)&(((local_1c0->
                                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start)->
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          )._M_impl.super__Vector_impl_data + lVar59) + 4) =
                     ((int)uVar39 + iVar28) - ((int)uVar10 + (int)piVar12);
                bVar61 = bVar62;
              }
              lVar59 = lVar59 + 0x18;
              iVar28 = (int)local_1a0;
              iVar27 = iVar27 + iVar28;
              iVar56 = iVar56 - iVar28;
              local_1d0 = (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           *)CONCAT44(local_1d0._4_4_,(int)local_1d0 + iVar28);
              ppEVar64 = ppEVar58;
              bVar62 = bVar61;
            } while (sVar52 * 0x18 != lVar59);
          }
          if (bVar61) {
            std::__cxx11::string::append((char *)&num_y_tiles);
          }
          else {
            __size = local_218;
            if (iVar48 != 0) {
              lVar59 = 1;
              sVar43 = 0;
              do {
                *(pointer *)(*plVar7 + sVar43 * 8) = __size;
                pvVar9 = (local_1c0->
                         super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                __size = __size + ((*(long *)((long)&(pvVar9->
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  )._M_impl.super__Vector_impl_data + lVar59 * 8) +
                                   lVar49) - *(long *)((long)pvVar9 + lVar59 * 8 + -8));
                sVar43 = sVar43 + 1;
                lVar59 = lVar59 + 3;
              } while (sVar52 != sVar43);
            }
          }
          local_228 = -4;
          puVar50 = __size;
        }
        else {
          iVar48 = 1;
          if (pEVar34->tile_level_mode == 2) {
            iVar48 = pOVar36->num_y_levels;
          }
          uVar25 = iVar48 * pOVar36->num_x_levels;
          bVar61 = 0 < (int)uVar25;
          puVar50 = local_218;
          if (0 < (int)uVar25) {
            bVar61 = true;
            local_f0 = 0;
            local_140 = 0;
            do {
              if (local_210 == (EXRImage *)0x0) {
                local_228 = -4;
                std::__cxx11::string::append((char *)&num_y_tiles);
                break;
              }
              if (pEVar34->tile_level_mode == 2) {
                uVar26 = local_210->level_y * pOVar36->num_x_levels + local_210->level_x;
              }
              else {
                uVar26 = 0;
                if (pEVar34->tile_level_mode == 1) {
                  uVar26 = local_210->level_x;
                }
              }
              if (local_f0 == uVar26) {
                pvVar6 = (pOVar36->offsets).
                         super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                plVar7 = *(long **)&pvVar6[local_f0].
                                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                    ._M_impl;
                lVar54 = ((long)*(pointer *)
                                 ((long)&pvVar6[local_f0].
                                         super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                         ._M_impl + 8) - (long)plVar7 >> 3) * -0x5555555555555555;
                lVar59 = plVar7[1];
                lVar51 = *plVar7;
                pTStack_200 = (pointer)0x0;
                _header = (pointer)&local_1f8;
                local_1f8._M_allocated_capacity =
                     local_1f8._M_allocated_capacity & 0xffffffffffffff00;
                iVar48 = (int)((ulong)(lVar59 - lVar51) >> 3);
                if ((((local_210->width < pEVar34->tile_size_x) ||
                     (local_210->height < pEVar34->tile_size_y)) && (local_210->level_x == 0)) &&
                   (local_210->level_y == 0)) {
LAB_001cdb92:
                  std::__cxx11::string::append(header);
                  iVar27 = -4;
                  bVar62 = false;
                  ppEVar58 = ppEVar64;
                }
                else {
                  uVar26 = iVar48 * (int)lVar54;
                  if (0 < (int)uVar26) {
                    lVar60 = 0x18;
                    iVar27 = 0;
                    lVar55 = 0;
                    bVar62 = false;
                    do {
                      pvVar46 = local_1c0;
                      local_1a0 = CONCAT44(local_1a0._4_4_,iVar27 % iVar48);
                      pEVar8 = local_210->tiles;
                      local_1d0 = *(vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                    **)((long)&pEVar8->offset_x + lVar60);
                      pvVar63 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1cda76;
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 ((long)&(local_1c0->
                                         super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start[local_140].
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data + lVar55),0x14);
                      pvVar9 = (pvVar46->
                               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start;
                      uVar39 = *(undefined8 *)
                                ((long)&pvVar9[local_140].
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data + lVar55);
                      uVar10 = *(undefined8 *)
                                ((long)&pvVar9[local_140].
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data + lVar55 + 8);
                      bVar22 = EncodePixelData((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                *)((long)&pvVar9[local_140].
                                                                                                                    
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data + lVar55),
                                               (uchar **)local_1d0,pEVar34->compression_type,
                                               *(int *)((long)pEVar8 + lVar60 + -8),
                                               pEVar34->tile_size_x,0,
                                               *(int *)((long)pEVar8 + lVar60 + -4),iVar24,iVar41,
                                               (size_t)&channel_offset_list,
                                               (vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                                                *)header,pvVar63,in_stack_fffffffffffffdc8,ppEVar64)
                      ;
                      bVar23 = true;
                      if (bVar22) {
                        pvVar9 = (local_1c0->
                                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start;
                        puVar11 = *(undefined4 **)
                                   ((long)&pvVar9[local_140].
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data + lVar55);
                        iVar56 = *(int *)((long)&pvVar9[local_140].
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data + lVar55 + 8);
                        *puVar11 = (undefined4)local_1a0;
                        *(int *)(*(long *)((long)&(local_1c0->
                                                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start
                                                  [local_140].
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data + lVar55) + 4) =
                             iVar27 / iVar48;
                        *(int *)(*(long *)((long)&(local_1c0->
                                                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start
                                                  [local_140].
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data + lVar55) + 8) =
                             local_210->level_x;
                        *(int *)(*(long *)((long)&(local_1c0->
                                                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start
                                                  [local_140].
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data + lVar55) + 0xc)
                             = local_210->level_y;
                        *(int *)(*(long *)((long)&(local_1c0->
                                                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start
                                                  [local_140].
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data + lVar55) + 0x10)
                             = ((int)uVar39 + iVar56) - ((int)uVar10 + (int)puVar11);
                        bVar23 = bVar62;
                      }
                      lVar55 = lVar55 + 0x18;
                      lVar60 = lVar60 + 0x20;
                      iVar27 = iVar27 + 1;
                      bVar62 = bVar23;
                    } while ((ulong)uVar26 * 0x18 != lVar55);
                    if (bVar23) goto LAB_001cdb92;
                  }
                  iVar27 = 0;
                  bVar62 = true;
                  ppEVar58 = ppEVar64;
                }
                if (bVar62) {
                  lVar54 = lVar54 << 0x20;
                  if (lVar54 != 0) {
                    lVar54 = lVar54 >> 0x20;
                    lVar55 = 0;
                    do {
                      if ((lVar59 - lVar51 & 0x7ffffffffU) != 0) {
                        lVar60 = local_140 * 3 + 1;
                        lVar53 = 0;
                        do {
                          *(pointer *)
                           (*(long *)(*(long *)&(pOVar36->offsets).
                                                super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start[local_f0].
                                                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                                ._M_impl + lVar55 * 0x18) + lVar53 * 8) = puVar50;
                          pvVar9 = (local_1c0->
                                   super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start;
                          puVar50 = puVar50 + ((*(long *)((long)&(pvVar9->
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  )._M_impl.super__Vector_impl_data + lVar60 * 8) +
                                               lVar49) - *(long *)((long)pvVar9 + lVar60 * 8 + -8));
                          lVar53 = lVar53 + 1;
                          lVar60 = lVar60 + 3;
                        } while ((long)iVar48 + (ulong)((long)iVar48 == 0) != lVar53);
                        local_140 = local_140 + lVar53;
                      }
                      lVar55 = lVar55 + 1;
                    } while (lVar55 != lVar54 + (ulong)(lVar54 == 0));
                  }
                  local_210 = local_210->next_level;
                  iVar27 = local_228;
                }
                else if (pTStack_200 != (pointer)0x0) {
                  std::__cxx11::string::_M_append((char *)&num_y_tiles,(ulong)_header);
                }
                ppEVar64 = ppEVar58;
                local_228 = iVar27;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_header != &local_1f8) {
                  operator_delete(_header);
                  ppEVar64 = ppEVar58;
                }
              }
              else {
                std::__cxx11::string::append((char *)&num_y_tiles);
                local_228 = -4;
                bVar62 = false;
              }
              if (!bVar62) break;
              local_f0 = local_f0 + 1;
              bVar61 = local_f0 < uVar25;
            } while (local_f0 != uVar25);
          }
        }
        if (!bVar61) {
          local_228 = 0;
          __size = puVar50;
        }
        if (channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(channel_offset_list.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        uVar25 = local_1c4;
        puVar50 = __size;
        if (((local_228 != 0) && (puVar50 = local_218, local_1b8 != (char **)0x0)) &&
           (num_y_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish != (pointer)0x0)) {
          pcVar29 = strdup((char *)num_y_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                   .super__Vector_impl_data._M_start);
          *local_1b8 = pcVar29;
        }
        if ((pointer *)
            num_y_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start !=
            &num_y_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage) {
          operator_delete(num_y_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_228 != 0) goto LAB_001ce1cf;
        pvVar42 = (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   *)((long)&(pvVar42->
                             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + 1);
        local_218 = puVar50;
      } while (pvVar42 != __n);
    }
    if (__size == (pointer)0x0) {
      _header = (pointer)&local_1f8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)header,"Output memory size is zero","");
      ppcVar19 = local_1b8;
      if (local_1b8 != (char **)0x0) {
        pcVar29 = strdup(_header);
        *ppcVar19 = pcVar29;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_header != &local_1f8) {
        operator_delete(_header);
      }
LAB_001ce1cf:
      __size = (pointer)0x0;
    }
    else {
      puVar37 = (uchar *)malloc((size_t)__size);
      *memory_out = puVar37;
      sVar33 = (long)memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      memcpy(puVar37,memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,sVar33);
      puVar37 = puVar37 + sVar33;
      if (uVar25 == 0) {
        uVar25 = 0;
      }
      else {
        pvVar42 = (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   *)0x0;
        do {
          local_1c0 = pvVar42;
          if (local_1a8[(long)pvVar42].tiles == (EXRTile *)0x0) {
            iVar48 = chunk_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[(long)pvVar42];
            memcpy(puVar37,(void *)**(undefined8 **)
                                     &((offset_data.
                                        super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>
                                        ._M_impl.super__Vector_impl_data._M_start[(long)pvVar42].
                                        offsets.
                                        super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                      )._M_impl,(long)iVar48 * 8);
            puVar37 = puVar37 + (long)iVar48 * 8;
          }
          else {
            if (ppEVar64[(long)pvVar42]->tile_level_mode == 2) {
              uVar25 = offset_data.
                       super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>
                       ._M_impl.super__Vector_impl_data._M_start[(long)pvVar42].num_y_levels *
                       offset_data.
                       super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>
                       ._M_impl.super__Vector_impl_data._M_start[(long)pvVar42].num_x_levels;
            }
            else {
              uVar25 = offset_data.
                       super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>
                       ._M_impl.super__Vector_impl_data._M_start[(long)pvVar42].num_x_levels;
            }
            if (0 < (int)uVar25) {
              pvVar46 = (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)0x0;
              do {
                pvVar6 = offset_data.
                         super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>
                         ._M_impl.super__Vector_impl_data._M_start[(long)pvVar42].offsets.
                         super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                pvVar38 = *(pointer *)
                           &pvVar6[(long)pvVar46].
                            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                            ._M_impl;
                local_1d0 = pvVar46;
                if (*(pointer *)
                     ((long)&pvVar6[(long)pvVar46].
                             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                             ._M_impl + 8) != pvVar38) {
                  lVar49 = 8;
                  uVar57 = 0;
                  do {
                    pvVar13 = *(void **)((long)pvVar38 + lVar49 + -8);
                    sVar33 = *(long *)((long)&(pvVar38->
                                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                              )._M_impl + lVar49) - (long)pvVar13;
                    memcpy(puVar37,pvVar13,sVar33);
                    puVar37 = puVar37 + sVar33;
                    uVar57 = uVar57 + 1;
                    pvVar6 = offset_data.
                             super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>
                             ._M_impl.super__Vector_impl_data._M_start[(long)pvVar42].offsets.
                             super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    pvVar38 = *(pointer *)
                               &pvVar6[(long)pvVar46].
                                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                ._M_impl;
                    lVar49 = lVar49 + 0x18;
                  } while (uVar57 < (ulong)(((long)*(pointer *)
                                                    ((long)&pvVar6[(long)pvVar46].
                                                                                                                        
                                                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                                  ._M_impl + 8) - (long)pvVar38 >> 3) *
                                           -0x5555555555555555));
                }
                pvVar46 = (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           *)((long)&(local_1d0->
                                     super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start + 1);
              } while (pvVar46 !=
                       (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)(ulong)uVar25);
            }
          }
          pvVar42 = (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     *)((long)&(local_1c0->
                               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start + 1);
          uVar25 = local_1c4;
        } while (pvVar42 != __n);
      }
      if (uVar25 != 0) {
        pvVar42 = (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   *)0x0;
        do {
          if (chunk_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[(long)pvVar42] != 0) {
            lVar49 = 8;
            uVar57 = 0;
            do {
              if (1 < uVar25) {
                *(int *)puVar37 = (int)pvVar42;
                puVar37 = puVar37 + 4;
              }
              pvVar9 = data_lists.
                       super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(long)pvVar42].
                       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pvVar13 = *(void **)((long)pvVar9 + lVar49 + -8);
              memcpy(puVar37,pvVar13,
                     *(long *)((long)&(pvVar9->
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      )._M_impl.super__Vector_impl_data + lVar49) - (long)pvVar13);
              pvVar9 = data_lists.
                       super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(long)pvVar42].
                       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              puVar37 = puVar37 + (*(long *)((long)&(pvVar9->
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  )._M_impl.super__Vector_impl_data + lVar49) -
                                  *(long *)((long)pvVar9 + lVar49 + -8));
              uVar57 = uVar57 + 1;
              lVar49 = lVar49 + 0x18;
            } while (uVar57 < (ulong)(long)chunk_count.super__Vector_base<int,_std::allocator<int>_>
                                           ._M_impl.super__Vector_impl_data._M_start[(long)pvVar42])
            ;
          }
          pvVar42 = (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     *)((long)&(pvVar42->
                               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start + 1);
        } while (pvVar42 != __n);
      }
    }
    std::
    vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
    ::~vector(&data_lists);
LAB_001ce296:
    std::
    vector<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>,_std::allocator<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>_>_>
    ::~vector(&channels);
    std::vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>::~vector(&offset_data);
    if (chunk_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(chunk_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return (size_t)__size;
}

Assistant:

static size_t SaveEXRNPartImageToMemory(const EXRImage* exr_images,
                                        const EXRHeader** exr_headers,
                                        unsigned int num_parts,
                                        unsigned char** memory_out, const char** err) {
  if (exr_images == NULL || exr_headers == NULL || num_parts == 0 ||
      memory_out == NULL) {
    SetErrorMessage("Invalid argument for SaveEXRNPartImageToMemory",
                    err);
    return 0;
  }
  {
    for (unsigned int i = 0; i < num_parts; ++i) {
      if (exr_headers[i]->compression_type < 0) {
        SetErrorMessage("Invalid argument for SaveEXRNPartImageToMemory",
                        err);
        return 0;
      }
#if !TINYEXR_USE_PIZ
      if (exr_headers[i]->compression_type == TINYEXR_COMPRESSIONTYPE_PIZ) {
        SetErrorMessage("PIZ compression is not supported in this build",
                        err);
        return 0;
      }
#endif
#if !TINYEXR_USE_ZFP
      if (exr_headers[i]->compression_type == TINYEXR_COMPRESSIONTYPE_ZFP) {
        SetErrorMessage("ZFP compression is not supported in this build",
                        err);
        return 0;
      }
#else
      for (int c = 0; c < exr_header->num_channels; ++c) {
        if (exr_headers[i]->requested_pixel_types[c] != TINYEXR_PIXELTYPE_FLOAT) {
          SetErrorMessage("Pixel type must be FLOAT for ZFP compression",
                          err);
          return 0;
        }
      }
#endif
    }
  }

  std::vector<unsigned char> memory;

  // Header
  {
    const char header[] = { 0x76, 0x2f, 0x31, 0x01 };
    memory.insert(memory.end(), header, header + 4);
  }

  // Version
  // using value from the first header
  int long_name = exr_headers[0]->long_name;
  {
    char marker[] = { 2, 0, 0, 0 };
    /* @todo
    if (exr_header->non_image) {
    marker[1] |= 0x8;
    }
    */
    // tiled
    if (num_parts == 1 && exr_images[0].tiles) {
      marker[1] |= 0x2;
    }
    // long_name
    if (long_name) {
      marker[1] |= 0x4;
    }
    // multipart
    if (num_parts > 1) {
      marker[1] |= 0x10;
    }
    memory.insert(memory.end(), marker, marker + 4);
  }

  int total_chunk_count = 0;
  std::vector<int> chunk_count(num_parts);
  std::vector<OffsetData> offset_data(num_parts);
  for (unsigned int i = 0; i < num_parts; ++i) {
    if (!exr_images[i].tiles) {
      int num_scanlines = NumScanlines(exr_headers[i]->compression_type);
      chunk_count[i] =
        (exr_images[i].height + num_scanlines - 1) / num_scanlines;
      InitSingleResolutionOffsets(offset_data[i], chunk_count[i]);
      total_chunk_count += chunk_count[i];
    } else {
      {
        std::vector<int> num_x_tiles, num_y_tiles;
        PrecalculateTileInfo(num_x_tiles, num_y_tiles, exr_headers[i]);
        chunk_count[i] =
          InitTileOffsets(offset_data[i], exr_headers[i], num_x_tiles, num_y_tiles);
        total_chunk_count += chunk_count[i];
      }
    }
  }
  // Write attributes to memory buffer.
  std::vector< std::vector<tinyexr::ChannelInfo> > channels(num_parts);
  {
    std::set<std::string> partnames;
    for (unsigned int i = 0; i < num_parts; ++i) {
      //channels
      {
        std::vector<unsigned char> data;

        for (int c = 0; c < exr_headers[i]->num_channels; c++) {
          tinyexr::ChannelInfo info;
          info.p_linear = 0;
          info.pixel_type = exr_headers[i]->pixel_types[c];
          info.requested_pixel_type = exr_headers[i]->requested_pixel_types[c];
          info.x_sampling = 1;
          info.y_sampling = 1;
          info.name = std::string(exr_headers[i]->channels[c].name);
          channels[i].push_back(info);
        }

        tinyexr::WriteChannelInfo(data, channels[i]);

        tinyexr::WriteAttributeToMemory(&memory, "channels", "chlist", &data.at(0),
                                        static_cast<int>(data.size()));
      }

      {
        int comp = exr_headers[i]->compression_type;
        swap4(&comp);
        WriteAttributeToMemory(
          &memory, "compression", "compression",
          reinterpret_cast<const unsigned char*>(&comp), 1);
      }

      {
        int data[4] = { 0, 0, exr_images[i].width - 1, exr_images[i].height - 1 };
        swap4(&data[0]);
        swap4(&data[1]);
        swap4(&data[2]);
        swap4(&data[3]);
        WriteAttributeToMemory(
          &memory, "dataWindow", "box2i",
          reinterpret_cast<const unsigned char*>(data), sizeof(int) * 4);

        int data0[4] = { 0, 0, exr_images[0].width - 1, exr_images[0].height - 1 };
        swap4(&data0[0]);
        swap4(&data0[1]);
        swap4(&data0[2]);
        swap4(&data0[3]);
        // Note: must be the same across parts (currently, using value from the first header)
        WriteAttributeToMemory(
          &memory, "displayWindow", "box2i",
          reinterpret_cast<const unsigned char*>(data0), sizeof(int) * 4);
      }

      {
        unsigned char line_order = 0;  // @fixme { read line_order from EXRHeader }
        WriteAttributeToMemory(&memory, "lineOrder", "lineOrder",
                               &line_order, 1);
      }

      {
        // Note: must be the same across parts
        float aspectRatio = 1.0f;
        swap4(&aspectRatio);
        WriteAttributeToMemory(
          &memory, "pixelAspectRatio", "float",
          reinterpret_cast<const unsigned char*>(&aspectRatio), sizeof(float));
      }

      {
        float center[2] = { 0.0f, 0.0f };
        swap4(&center[0]);
        swap4(&center[1]);
        WriteAttributeToMemory(
          &memory, "screenWindowCenter", "v2f",
          reinterpret_cast<const unsigned char*>(center), 2 * sizeof(float));
      }

      {
        float w = 1.0f;
        swap4(&w);
        WriteAttributeToMemory(&memory, "screenWindowWidth", "float",
                               reinterpret_cast<const unsigned char*>(&w),
                               sizeof(float));
      }

      if (exr_images[i].tiles) {
        unsigned char tile_mode = static_cast<unsigned char>(exr_headers[i]->tile_level_mode & 0x3);
        if (exr_headers[i]->tile_rounding_mode) tile_mode |= (1u << 4u);
        //unsigned char data[9] = { 0, 0, 0, 0, 0, 0, 0, 0, 0 };
        unsigned int datai[3] = { 0, 0, 0 };
        unsigned char* data = reinterpret_cast<unsigned char*>(&datai[0]);
        datai[0] = static_cast<unsigned int>(exr_headers[i]->tile_size_x);
        datai[1] = static_cast<unsigned int>(exr_headers[i]->tile_size_y);
        data[8] = tile_mode;
        swap4(reinterpret_cast<unsigned int*>(&data[0]));
        swap4(reinterpret_cast<unsigned int*>(&data[4]));
        WriteAttributeToMemory(
          &memory, "tiles", "tiledesc",
          reinterpret_cast<const unsigned char*>(data), 9);
      }

      // must be present for multi-part files - according to spec.
      if (num_parts > 1) {
        // name
        {
          size_t len = 0;
          if ((len = strlen(exr_headers[i]->name)) > 0) {
            partnames.emplace(exr_headers[i]->name);
            if (partnames.size() != i + 1) {
              SetErrorMessage("'name' attributes must be unique for a multi-part file", err);
              return 0;
            }
            WriteAttributeToMemory(
              &memory, "name", "string",
              reinterpret_cast<const unsigned char*>(exr_headers[i]->name),
              static_cast<int>(len));
          } else {
            SetErrorMessage("Invalid 'name' attribute for a multi-part file", err);
            return 0;
          }
        }
        // type
        {
          const char* type = "scanlineimage";
          if (exr_images[i].tiles) type = "tiledimage";
          WriteAttributeToMemory(
            &memory, "type", "string",
            reinterpret_cast<const unsigned char*>(type),
            static_cast<int>(strlen(type)));
        }
        // chunkCount
        {
          WriteAttributeToMemory(
            &memory, "chunkCount", "int",
            reinterpret_cast<const unsigned char*>(&chunk_count[i]),
            4);
        }
      }

      // Custom attributes
      if (exr_headers[i]->num_custom_attributes > 0) {
        for (int j = 0; j < exr_headers[i]->num_custom_attributes; j++) {
          tinyexr::WriteAttributeToMemory(
            &memory, exr_headers[i]->custom_attributes[j].name,
            exr_headers[i]->custom_attributes[j].type,
            reinterpret_cast<const unsigned char*>(
              exr_headers[i]->custom_attributes[j].value),
            exr_headers[i]->custom_attributes[j].size);
        }
      }

      {  // end of header
        memory.push_back(0);
      }
    }
  }
  if (num_parts > 1) {
    // end of header list
    memory.push_back(0);
  }

  tinyexr_uint64 chunk_offset = memory.size() + size_t(total_chunk_count) * sizeof(tinyexr_uint64);

  tinyexr_uint64 total_size = 0;
  std::vector< std::vector< std::vector<unsigned char> > > data_lists(num_parts);
  for (unsigned int i = 0; i < num_parts; ++i) {
    std::string e;
    int ret = EncodeChunk(&exr_images[i], exr_headers[i],
                          channels[i],
                          chunk_count[i],
                          // starting offset of current chunk after part-number
                          chunk_offset,
                          num_parts > 1,
                          offset_data[i], // output: block offsets, must be initialized
                          data_lists[i], // output
                          total_size, // output
                          &e);
    if (ret != TINYEXR_SUCCESS) {
      if (!e.empty()) {
        tinyexr::SetErrorMessage(e, err);
      }
      return 0;
    }
    chunk_offset = total_size;
  }

  // Allocating required memory
  if (total_size == 0) { // something went wrong
    tinyexr::SetErrorMessage("Output memory size is zero", err);
    return 0;
  }
  (*memory_out) = static_cast<unsigned char*>(malloc(size_t(total_size)));

  // Writing header
  memcpy((*memory_out), &memory[0], memory.size());
  unsigned char* memory_ptr = *memory_out + memory.size();
  size_t sum = memory.size();
  ((void)(sum));

  // Writing offset data for chunks
  for (unsigned int i = 0; i < num_parts; ++i) {
    if (exr_images[i].tiles) {
      const EXRImage* level_image = &exr_images[i];
      int num_levels = (exr_headers[i]->tile_level_mode != TINYEXR_TILE_RIPMAP_LEVELS) ?
        offset_data[i].num_x_levels : (offset_data[i].num_x_levels * offset_data[i].num_y_levels);
      for (int level_index = 0; level_index < num_levels; ++level_index) {
        for (size_t j = 0; j < offset_data[i].offsets[level_index].size(); ++j) {
          size_t num_bytes = sizeof(tinyexr_uint64) * offset_data[i].offsets[level_index][j].size();
          sum += num_bytes;
          assert(sum <= total_size);
          memcpy(memory_ptr,
                 reinterpret_cast<unsigned char*>(&offset_data[i].offsets[level_index][j][0]),
                 num_bytes);
          memory_ptr += num_bytes;
        }
        level_image = level_image->next_level;
      }
    } else {
      size_t num_bytes = sizeof(tinyexr::tinyexr_uint64) * static_cast<size_t>(chunk_count[i]);
      sum += num_bytes;
      assert(sum <= total_size);
      std::vector<tinyexr::tinyexr_uint64>& offsets = offset_data[i].offsets[0][0];
      memcpy(memory_ptr, reinterpret_cast<unsigned char*>(&offsets[0]), num_bytes);
      memory_ptr += num_bytes;
    }
  }

  // Writing chunk data
  for (unsigned int i = 0; i < num_parts; ++i) {
    for (size_t j = 0; j < static_cast<size_t>(chunk_count[i]); ++j) {
      if (num_parts > 1) {
        sum += 4;
        assert(sum <= total_size);
        unsigned int part_number = i;
        swap4(&part_number);
        memcpy(memory_ptr, &part_number, 4);
        memory_ptr += 4;
      }
      sum += data_lists[i][j].size();
      assert(sum <= total_size);
      memcpy(memory_ptr, &data_lists[i][j][0], data_lists[i][j].size());
      memory_ptr += data_lists[i][j].size();
    }
  }
  assert(sum == total_size);
  return size_t(total_size);  // OK
}